

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLExport.cpp
# Opt level: O1

bool __thiscall
ODDLParser::OpenDDLExport::writeNode(OpenDDLExport *this,DDLNode *node,string *statement)

{
  IOStreamBase *pIVar1;
  bool bVar2;
  DataArrayList *al;
  Value *val;
  DDLNode *this_00;
  string *this_01;
  
  writeNodeHeader(this,node,statement);
  bVar2 = DDLNode::hasProperties(node);
  if (bVar2) {
    writeProperties(this,node,statement);
  }
  std::__cxx11::string::append((char *)statement);
  std::__cxx11::string::_M_replace((ulong)statement,0,(char *)statement->_M_string_length,0x768888);
  this_00 = node;
  al = DDLNode::getDataArrayList(node);
  if (al != (DataArrayList *)0x0) {
    writeValueType((OpenDDLExport *)this_00,al->m_dataList->m_type,al->m_numItems,statement);
    writeValueArray(this,al,statement);
  }
  val = DDLNode::getValue(node);
  if (val != (Value *)0x0) {
    writeValueType((OpenDDLExport *)node,val->m_type,1,statement);
    std::__cxx11::string::_M_replace
              ((ulong)statement,0,(char *)statement->_M_string_length,0x729290);
    this_01 = statement;
    std::__cxx11::string::append((char *)statement);
    writeValue((OpenDDLExport *)this_01,val,statement);
    std::__cxx11::string::_M_replace
              ((ulong)statement,0,(char *)statement->_M_string_length,0x768888);
    std::__cxx11::string::append((char *)statement);
  }
  std::__cxx11::string::_M_replace((ulong)statement,0,(char *)statement->_M_string_length,0x768888);
  std::__cxx11::string::append((char *)statement);
  pIVar1 = this->m_stream;
  if ((pIVar1 != (IOStreamBase *)0x0) && (statement->_M_string_length != 0)) {
    (*pIVar1->_vptr_IOStreamBase[6])(pIVar1,statement);
  }
  return true;
}

Assistant:

bool OpenDDLExport::writeNode( DDLNode *node, std::string &statement ) {
    writeNodeHeader( node, statement );
    if (node->hasProperties()) {
        writeProperties( node, statement );
    }
    writeLineEnd( statement );

    statement = "}";
    DataArrayList *al( node->getDataArrayList() );
    if ( ddl_nullptr != al ) {
        writeValueType( al->m_dataList->m_type, al->m_numItems, statement );
        writeValueArray( al, statement );
    }
    Value *v( node->getValue() );
    if (ddl_nullptr != v ) {
        writeValueType( v->m_type, 1, statement );
        statement = "{";
        writeLineEnd( statement );
        writeValue( v, statement );
        statement = "}";
        writeLineEnd( statement );
    }
    statement = "}";
    writeLineEnd( statement );

    writeToStream( statement );

    return true;
}